

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.c
# Opt level: O2

int flatcc_json_parser_struct_as_root
              (flatcc_builder_t *B,flatcc_json_parser_t *ctx,char *buf,size_t bufsiz,
              flatcc_json_parser_flags_t flags,char *fid,flatcc_json_parser_table_f *parser)

{
  int iVar1;
  flatcc_builder_ref_t fVar2;
  char *pcVar3;
  flatcc_json_parser_t *pfVar4;
  flatcc_builder_ref_t root;
  flatcc_json_parser_t _ctx;
  
  pfVar4 = ctx;
  if (ctx == (flatcc_json_parser_t *)0x0) {
    pfVar4 = &_ctx;
  }
  pfVar4->flags = 0;
  pfVar4->unquoted = 0;
  pfVar4->line = 0;
  pfVar4->pos = 0;
  *(undefined8 *)&pfVar4->error = 0;
  pfVar4->start = (char *)0x0;
  pfVar4->end_loc = (char *)0x0;
  pfVar4->end = (char *)0x0;
  pfVar4->error_loc = (char *)0x0;
  pfVar4->ctx = B;
  pfVar4->line_start = buf;
  pfVar4->line = 1;
  pfVar4->flags = flags;
  pfVar4->start = buf;
  pfVar4->end = buf + bufsiz;
  pfVar4->error_loc = buf;
  iVar1 = flatcc_builder_start_buffer(B,fid,0,(ushort)(flags >> 1) & 2);
  if (iVar1 == 0) {
    pcVar3 = (*parser)(pfVar4,buf,buf + bufsiz,&root);
    pfVar4 = ctx;
    if (ctx == (flatcc_json_parser_t *)0x0) {
      pfVar4 = &_ctx;
    }
    iVar1 = pfVar4->error;
    if (iVar1 == 0) {
      fVar2 = flatcc_builder_end_buffer(B,root);
      iVar1 = -1;
      if (fVar2 != 0) {
        pfVar4 = &_ctx;
        if (ctx != (flatcc_json_parser_t *)0x0) {
          pfVar4 = ctx;
        }
        pfVar4->end_loc = pcVar3;
        iVar1 = 0;
      }
    }
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int flatcc_json_parser_struct_as_root(flatcc_builder_t *B, flatcc_json_parser_t *ctx,
        const char *buf, size_t bufsiz, flatcc_json_parser_flags_t flags, const char *fid,
        flatcc_json_parser_table_f *parser)
{
    flatcc_json_parser_t _ctx;
    flatcc_builder_ref_t root;
    flatcc_builder_buffer_flags_t builder_flags = flags & flatcc_json_parser_f_with_size ? flatcc_builder_with_size : 0;

    ctx = ctx ? ctx : &_ctx;
    flatcc_json_parser_init(ctx, B, buf, buf + bufsiz, flags);
    if (flatcc_builder_start_buffer(B, fid, 0, builder_flags)) return -1;
    buf = parser(ctx, buf, buf + bufsiz, &root);
    if (ctx->error) {
        return ctx->error;
    }
    if (!flatcc_builder_end_buffer(B, root)) return -1;
    ctx->end_loc = buf;
    return 0;
}